

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O2

char * dirname(char *__path)

{
  ulong uVar1;
  string *in_RSI;
  allocator<char> local_11;
  
  uVar1 = std::__cxx11::string::rfind((char *)in_RSI,0x10d9f9);
  if (uVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)__path,"/",&local_11);
  }
  else if (uVar1 == 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)__path,in_RSI);
  }
  else {
    std::__cxx11::string::string((string *)__path,in_RSI,0,uVar1);
  }
  return __path;
}

Assistant:

string
dirname(const string& path)
{
    size_t pos = path.rfind("/");

    if(pos == std::string::npos)
        return path;
    else if(pos == 0)
        return "/";

    return string(path, 0, pos);
}